

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystemData.cpp
# Opt level: O0

void __thiscall
DIS::AcousticEmitterSystemData::marshal(AcousticEmitterSystemData *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_50 [8];
  AcousticBeamData x;
  size_t idx;
  DataStream *dataStream_local;
  AcousticEmitterSystemData *this_local;
  
  DataStream::operator<<(dataStream,this->_emitterSystemDataLength);
  sVar2 = std::vector<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>::size
                    (&this->_beamRecords);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  DataStream::operator<<(dataStream,this->_pad2);
  AcousticEmitterSystem::marshal(&this->_acousticEmitterSystem,dataStream);
  Vector3Float::marshal(&this->_emitterLocation,dataStream);
  x._fundamentalDataParameters._deBeamwidth = 0.0;
  x._fundamentalDataParameters._28_4_ = 0;
  while( true ) {
    uVar1 = x._fundamentalDataParameters._24_8_;
    sVar2 = std::vector<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>::size
                      (&this->_beamRecords);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>::operator[]
                       (&this->_beamRecords,x._fundamentalDataParameters._24_8_);
    AcousticBeamData::AcousticBeamData((AcousticBeamData *)local_50,pvVar3);
    AcousticBeamData::marshal((AcousticBeamData *)local_50,dataStream);
    AcousticBeamData::~AcousticBeamData((AcousticBeamData *)local_50);
    x._fundamentalDataParameters._24_8_ = x._fundamentalDataParameters._24_8_ + 1;
  }
  return;
}

Assistant:

void AcousticEmitterSystemData::marshal(DataStream& dataStream) const
{
    dataStream << _emitterSystemDataLength;
    dataStream << ( unsigned char )_beamRecords.size();
    dataStream << _pad2;
    _acousticEmitterSystem.marshal(dataStream);
    _emitterLocation.marshal(dataStream);

     for(size_t idx = 0; idx < _beamRecords.size(); idx++)
     {
        AcousticBeamData x = _beamRecords[idx];
        x.marshal(dataStream);
     }

}